

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O0

size_t read_callback(char *ptr,size_t size,size_t nmemb,void *userp)

{
  int eof;
  WriteThis *pooh;
  void *userp_local;
  size_t nmemb_local;
  size_t size_local;
  char *ptr_local;
  
  if (size * nmemb == 0) {
    ptr_local = (char *)0x0;
  }
  else if (**userp == '\0') {
    ptr_local = (char *)0x0;
  }
  else {
    *ptr = **userp;
    *(long *)userp = *userp + 1;
    ptr_local = (char *)0x1;
  }
  return (size_t)ptr_local;
}

Assistant:

static size_t read_callback(char *ptr, size_t size, size_t nmemb, void *userp)
{
#ifdef LIB644
  (void)ptr;
  (void)size;
  (void)nmemb;
  (void)userp;
  return CURL_READFUNC_ABORT;
#else

  struct WriteThis *pooh = (struct WriteThis *)userp;
  int eof = !*pooh->readptr;

  if(size*nmemb < 1)
    return 0;

#ifndef LIB645
  eof = pooh->sizeleft <= 0;
  if(!eof)
    pooh->sizeleft--;
#endif

  if(!eof) {
    *ptr = *pooh->readptr;           /* copy one single byte */
    pooh->readptr++;                 /* advance pointer */
    return 1;                        /* we return 1 byte at a time! */
  }

  return 0;                         /* no more data left to deliver */
#endif
}